

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O2

bool __thiscall cmFindProgramHelper::CheckDirectory(cmFindProgramHelper *this,string *path)

{
  string *psVar1;
  string *psVar2;
  bool bVar3;
  string *name;
  
  psVar2 = (this->Names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    name = psVar2;
    psVar1 = (this->Names).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (name == psVar1) break;
    bVar3 = CheckDirectoryForName(this,path,name);
    psVar2 = name + 1;
  } while (!bVar3);
  return name != psVar1;
}

Assistant:

bool CheckDirectory(std::string const& path)
    {
    for (std::vector<std::string>::iterator i = this->Names.begin();
         i != this->Names.end(); ++i)
      {
      if (this->CheckDirectoryForName(path, *i))
        {
        return true;
        }
      }
    return false;
    }